

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O1

void __thiscall
Assimp::MD5Importer::AttachChilds_Mesh
          (MD5Importer *this,int iParentID,aiNode *piParent,BoneList *bones)

{
  uint *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  aiNode **ppaVar34;
  pointer pBVar35;
  aiNode *this_00;
  long lVar36;
  ulong uVar37;
  long lVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 local_430 [1024];
  
  if ((piParent != (aiNode *)0x0) && (piParent->mNumChildren == 0)) {
    pBVar35 = (bones->
              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(bones->
                                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar35) >> 2) *
            -0x66e9095b) {
      lVar36 = 0x404;
      uVar37 = 0;
      do {
        if (((uint)iParentID != uVar37) &&
           (*(int *)((long)(pBVar35->super_BaseJointDescription).mName.data +
                    lVar36 + 0xfffffffffffffffcU) == iParentID)) {
          piParent->mNumChildren = piParent->mNumChildren + 1;
        }
        uVar37 = uVar37 + 1;
        pBVar35 = (bones->
                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar36 = lVar36 + 0x4b4;
      } while ((long)uVar37 <
               (long)((int)((ulong)((long)(bones->
                                          super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar35) >> 2) * -0x66e9095b));
    }
    if ((ulong)piParent->mNumChildren != 0) {
      ppaVar34 = (aiNode **)operator_new__((ulong)piParent->mNumChildren << 3);
      piParent->mChildren = ppaVar34;
      pBVar35 = (bones->
                super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(bones->
                                  super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar35) >> 2)
              * -0x66e9095b) {
        lVar36 = 0;
        lVar38 = 0;
        do {
          if (((ulong)(uint)iParentID * 0x4b4 != lVar36) &&
             (*(int *)((long)&(pBVar35->super_BaseJointDescription).mParentIndex + lVar36) ==
              iParentID)) {
            this_00 = (aiNode *)operator_new(0x478);
            aiNode::aiNode(this_00);
            ppaVar34 = piParent->mChildren;
            piParent->mChildren = ppaVar34 + 1;
            *ppaVar34 = this_00;
            puVar1 = (uint *)((long)(((bones->
                                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super_BaseJointDescription).mName.data +
                             lVar36 + 0xfffffffffffffffcU);
            uVar25 = *puVar1;
            if (0x3fe < *puVar1) {
              uVar25 = 0x3ff;
            }
            uVar37 = (ulong)uVar25;
            memcpy(local_430,puVar1 + 1,uVar37);
            local_430[uVar37] = 0;
            (this_00->mName).length = uVar25;
            memcpy((this_00->mName).data,local_430,uVar37);
            (this_00->mName).data[uVar37] = '\0';
            this_00->mParent = piParent;
            fVar45 = (float)puVar1[0x105];
            fVar3 = (float)puVar1[0x106];
            fVar4 = (float)puVar1[0x107];
            fVar46 = fVar45 * fVar45;
            fVar47 = fVar3 * fVar3;
            fVar48 = fVar4 * fVar4;
            fVar40 = ((1.0 - fVar46) - fVar47) - fVar48;
            fVar39 = 0.0;
            if (0.0 <= fVar40) {
              if (fVar40 < 0.0) {
                fVar39 = sqrtf(fVar40);
              }
              else {
                fVar39 = SQRT(fVar40);
              }
            }
            fVar43 = fVar45 * fVar3 + fVar4 * fVar39;
            fVar44 = fVar45 * fVar4 - fVar3 * fVar39;
            fVar41 = fVar45 * fVar3 - fVar4 * fVar39;
            fVar40 = fVar3 * fVar4 + fVar45 * fVar39;
            fVar42 = fVar3 * fVar39 + fVar45 * fVar4;
            fVar45 = fVar3 * fVar4 - fVar45 * fVar39;
            pBVar35 = (bones->
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(float *)((long)&(pBVar35->mTransform).a1 + lVar36) =
                 1.0 - (fVar47 + fVar48 + fVar47 + fVar48);
            *(float *)((long)&(pBVar35->mTransform).a2 + lVar36) = fVar43 + fVar43;
            *(float *)((long)&(pBVar35->mTransform).a3 + lVar36) = fVar44 + fVar44;
            *(undefined4 *)((long)&(pBVar35->mTransform).a4 + lVar36) = 0;
            *(float *)((long)&(pBVar35->mTransform).b1 + lVar36) = fVar41 + fVar41;
            *(float *)((long)&(pBVar35->mTransform).b2 + lVar36) =
                 1.0 - (fVar48 + fVar46 + fVar48 + fVar46);
            *(float *)((long)&(pBVar35->mTransform).b3 + lVar36) = fVar40 + fVar40;
            *(undefined4 *)((long)&(pBVar35->mTransform).b4 + lVar36) = 0;
            *(float *)((long)&(pBVar35->mTransform).c1 + lVar36) = fVar42 + fVar42;
            *(float *)((long)&(pBVar35->mTransform).c2 + lVar36) = fVar45 + fVar45;
            *(float *)((long)&(pBVar35->mTransform).c3 + lVar36) =
                 1.0 - (fVar46 + fVar47 + fVar46 + fVar47);
            puVar2 = (undefined8 *)((long)&(pBVar35->mTransform).c4 + lVar36);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined4 *)((long)&(pBVar35->mTransform).d4 + lVar36) = 0x3f800000;
            pBVar35 = (bones->
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)((long)&(pBVar35->mTransform).a4 + lVar36) =
                 *(undefined4 *)((long)&(pBVar35->mPositionXYZ).x + lVar36);
            pBVar35 = (bones->
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)((long)&(pBVar35->mTransform).b4 + lVar36) =
                 *(undefined4 *)((long)&(pBVar35->mPositionXYZ).y + lVar36);
            pBVar35 = (bones->
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)((long)&(pBVar35->mTransform).c4 + lVar36) =
                 *(undefined4 *)((long)&(pBVar35->mPositionXYZ).z + lVar36);
            pBVar35 = (bones->
                      super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (undefined8 *)((long)&(pBVar35->mTransform).a1 + lVar36);
            uVar26 = *puVar2;
            uVar27 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pBVar35->mTransform).b1 + lVar36);
            uVar28 = *puVar2;
            uVar29 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pBVar35->mTransform).c1 + lVar36);
            uVar30 = *puVar2;
            uVar31 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pBVar35->mTransform).d1 + lVar36);
            uVar32 = *puVar2;
            uVar33 = puVar2[1];
            puVar2 = (undefined8 *)((long)&(pBVar35->mInvTransform).d1 + lVar36);
            *puVar2 = uVar32;
            puVar2[1] = uVar33;
            puVar2 = (undefined8 *)((long)&(pBVar35->mInvTransform).c1 + lVar36);
            *puVar2 = uVar30;
            puVar2[1] = uVar31;
            puVar2 = (undefined8 *)((long)&(pBVar35->mInvTransform).b1 + lVar36);
            *puVar2 = uVar28;
            puVar2[1] = uVar29;
            puVar2 = (undefined8 *)((long)&(pBVar35->mInvTransform).a1 + lVar36);
            *puVar2 = uVar26;
            puVar2[1] = uVar27;
            (this_00->mTransformation).c1 = (float)(int)uVar30;
            (this_00->mTransformation).c2 = (float)(int)((ulong)uVar30 >> 0x20);
            (this_00->mTransformation).c3 = (float)(int)uVar31;
            (this_00->mTransformation).c4 = (float)(int)((ulong)uVar31 >> 0x20);
            (this_00->mTransformation).a1 = (float)(int)uVar26;
            (this_00->mTransformation).a2 = (float)(int)((ulong)uVar26 >> 0x20);
            (this_00->mTransformation).a3 = (float)(int)uVar27;
            (this_00->mTransformation).a4 = (float)(int)((ulong)uVar27 >> 0x20);
            (this_00->mTransformation).d1 = (float)(int)uVar32;
            (this_00->mTransformation).d2 = (float)(int)((ulong)uVar32 >> 0x20);
            (this_00->mTransformation).d3 = (float)(int)uVar33;
            (this_00->mTransformation).d4 = (float)(int)((ulong)uVar33 >> 0x20);
            (this_00->mTransformation).b1 = (float)(int)uVar28;
            (this_00->mTransformation).b2 = (float)(int)((ulong)uVar28 >> 0x20);
            (this_00->mTransformation).b3 = (float)(int)uVar29;
            (this_00->mTransformation).b4 = (float)(int)((ulong)uVar29 >> 0x20);
            aiMatrix4x4t<float>::Inverse
                      ((aiMatrix4x4t<float> *)
                       ((long)&(((bones->
                                 super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->mInvTransform).a1 +
                       lVar36));
            if (iParentID != -1) {
              pBVar35 = (bones->
                        super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              fVar45 = pBVar35[iParentID].mInvTransform.a1;
              fVar3 = pBVar35[iParentID].mInvTransform.a2;
              fVar4 = pBVar35[iParentID].mInvTransform.a3;
              fVar39 = pBVar35[iParentID].mInvTransform.a4;
              fVar40 = (this_00->mTransformation).b1;
              fVar46 = (this_00->mTransformation).a1;
              fVar47 = (this_00->mTransformation).a2;
              fVar48 = (this_00->mTransformation).c1;
              fVar41 = (this_00->mTransformation).d1;
              fVar42 = (this_00->mTransformation).b2;
              fVar43 = (this_00->mTransformation).c2;
              fVar44 = (this_00->mTransformation).d2;
              fVar5 = (this_00->mTransformation).b3;
              fVar6 = (this_00->mTransformation).a3;
              fVar7 = (this_00->mTransformation).c3;
              fVar8 = (this_00->mTransformation).d3;
              fVar9 = (this_00->mTransformation).b4;
              fVar10 = (this_00->mTransformation).a4;
              fVar11 = (this_00->mTransformation).c4;
              fVar12 = (this_00->mTransformation).d4;
              fVar13 = pBVar35[iParentID].mInvTransform.b2;
              fVar14 = pBVar35[iParentID].mInvTransform.b1;
              fVar15 = pBVar35[iParentID].mInvTransform.b3;
              fVar16 = pBVar35[iParentID].mInvTransform.b4;
              fVar17 = pBVar35[iParentID].mInvTransform.c2;
              fVar18 = pBVar35[iParentID].mInvTransform.c1;
              fVar19 = pBVar35[iParentID].mInvTransform.c3;
              fVar20 = pBVar35[iParentID].mInvTransform.c4;
              fVar21 = pBVar35[iParentID].mInvTransform.d2;
              fVar22 = pBVar35[iParentID].mInvTransform.d1;
              fVar23 = pBVar35[iParentID].mInvTransform.d3;
              fVar24 = pBVar35[iParentID].mInvTransform.d4;
              (this_00->mTransformation).a1 =
                   fVar41 * fVar39 + fVar48 * fVar4 + fVar46 * fVar45 + fVar3 * fVar40;
              (this_00->mTransformation).a2 =
                   fVar44 * fVar39 + fVar43 * fVar4 + fVar47 * fVar45 + fVar3 * fVar42;
              (this_00->mTransformation).a3 =
                   fVar8 * fVar39 + fVar7 * fVar4 + fVar6 * fVar45 + fVar3 * fVar5;
              (this_00->mTransformation).a4 =
                   fVar39 * fVar12 + fVar4 * fVar11 + fVar45 * fVar10 + fVar3 * fVar9;
              (this_00->mTransformation).b1 =
                   fVar41 * fVar16 + fVar48 * fVar15 + fVar46 * fVar14 + fVar13 * fVar40;
              (this_00->mTransformation).b2 =
                   fVar44 * fVar16 + fVar43 * fVar15 + fVar47 * fVar14 + fVar13 * fVar42;
              (this_00->mTransformation).b3 =
                   fVar8 * fVar16 + fVar7 * fVar15 + fVar6 * fVar14 + fVar13 * fVar5;
              (this_00->mTransformation).b4 =
                   fVar16 * fVar12 + fVar15 * fVar11 + fVar14 * fVar10 + fVar13 * fVar9;
              (this_00->mTransformation).c1 =
                   fVar41 * fVar20 + fVar48 * fVar19 + fVar46 * fVar18 + fVar17 * fVar40;
              (this_00->mTransformation).c2 =
                   fVar44 * fVar20 + fVar43 * fVar19 + fVar47 * fVar18 + fVar17 * fVar42;
              (this_00->mTransformation).c3 =
                   fVar8 * fVar20 + fVar7 * fVar19 + fVar6 * fVar18 + fVar17 * fVar5;
              (this_00->mTransformation).c4 =
                   fVar20 * fVar12 + fVar19 * fVar11 + fVar18 * fVar10 + fVar17 * fVar9;
              (this_00->mTransformation).d1 =
                   fVar41 * fVar24 + fVar48 * fVar23 + fVar46 * fVar22 + fVar40 * fVar21;
              (this_00->mTransformation).d2 =
                   fVar44 * fVar24 + fVar43 * fVar23 + fVar47 * fVar22 + fVar42 * fVar21;
              (this_00->mTransformation).d3 =
                   fVar8 * fVar24 + fVar7 * fVar23 + fVar6 * fVar22 + fVar5 * fVar21;
              (this_00->mTransformation).d4 =
                   fVar12 * fVar24 + fVar11 * fVar23 + fVar10 * fVar22 + fVar21 * fVar9;
            }
            AttachChilds_Mesh(this,(int)lVar38,this_00,bones);
          }
          lVar38 = lVar38 + 1;
          pBVar35 = (bones->
                    super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar36 = lVar36 + 0x4b4;
        } while (lVar38 < (int)((ulong)((long)(bones->
                                              super__Vector_base<Assimp::MD5::BoneDesc,_std::allocator<Assimp::MD5::BoneDesc>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pBVar35) >> 2) * -0x66e9095b);
      }
      piParent->mChildren = piParent->mChildren + -(ulong)piParent->mNumChildren;
    }
    return;
  }
  __assert_fail("__null != piParent && !piParent->mNumChildren",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MD5/MD5Loader.cpp"
                ,0x10b,"void Assimp::MD5Importer::AttachChilds_Mesh(int, aiNode *, BoneList &)");
}

Assistant:

void MD5Importer::AttachChilds_Mesh(int iParentID,aiNode* piParent, BoneList& bones)
{
    ai_assert(NULL != piParent && !piParent->mNumChildren);

    // First find out how many children we'll have
    for (int i = 0; i < (int)bones.size();++i)  {
        if (iParentID != i && bones[i].mParentIndex == iParentID)   {
            ++piParent->mNumChildren;
        }
    }
    if (piParent->mNumChildren) {
        piParent->mChildren = new aiNode*[piParent->mNumChildren];
        for (int i = 0; i < (int)bones.size();++i)  {
            // (avoid infinite recursion)
            if (iParentID != i && bones[i].mParentIndex == iParentID)   {
                aiNode* pc;
                // setup a new node
                *piParent->mChildren++ = pc = new aiNode();
                pc->mName = aiString(bones[i].mName);
                pc->mParent = piParent;

                // get the transformation matrix from rotation and translational components
                aiQuaternion quat;
                MD5::ConvertQuaternion ( bones[i].mRotationQuat, quat );

                bones[i].mTransform = aiMatrix4x4 ( quat.GetMatrix());
                bones[i].mTransform.a4 = bones[i].mPositionXYZ.x;
                bones[i].mTransform.b4 = bones[i].mPositionXYZ.y;
                bones[i].mTransform.c4 = bones[i].mPositionXYZ.z;

                // store it for later use
                pc->mTransformation = bones[i].mInvTransform = bones[i].mTransform;
                bones[i].mInvTransform.Inverse();

                // the transformations for each bone are absolute, so we need to multiply them
                // with the inverse of the absolute matrix of the parent joint
                if (-1 != iParentID)    {
                    pc->mTransformation = bones[iParentID].mInvTransform * pc->mTransformation;
                }

                // add children to this node, too
                AttachChilds_Mesh( i, pc, bones);
            }
        }
        // undo offset computations
        piParent->mChildren -= piParent->mNumChildren;
    }
}